

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O2

void motor_action(servo_motor *m)

{
  int iVar1;
  ostream *poVar2;
  char c;
  int new_value;
  string new_mode;
  byte local_d5;
  int local_d4;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [48];
  string local_90;
  string local_70;
  string local_50;
  
  local_d4 = 0;
  local_d5 = 0;
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  do {
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<(poVar2,"*** servo motor (");
    ev3dev::servo_motor::address_abi_cxx11_(&local_50,m);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,") actions ***");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"(c)ommand");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"(p)osition_sp  (");
    iVar1 = ev3dev::servo_motor::position_sp(m);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"(r)ate_sp      (");
    iVar1 = ev3dev::servo_motor::rate_sp(m);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"mi(n) pulse sp (");
    iVar1 = ev3dev::servo_motor::min_pulse_sp(m);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"mi(d) pulse sp (");
    iVar1 = ev3dev::servo_motor::mid_pulse_sp(m);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"ma(x) pulse sp (");
    iVar1 = ev3dev::servo_motor::max_pulse_sp(m);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"p(o)larity     [");
    ev3dev::servo_motor::polarity_abi_cxx11_(&local_70,m);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<(poVar2,"(b)ack");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<(poVar2,"Choice: ");
    std::operator>>((istream *)&std::cin,(char *)&local_d5);
    if (local_d5 - 0x6e < 0xb) {
      (*(code *)(&DAT_0011d050 + *(int *)(&DAT_0011d050 + (ulong)(local_d5 - 0x6e) * 4)))();
      return;
    }
    if (local_d5 == 99) {
      std::operator<<((ostream *)&std::cout,"command (run, float): ");
      std::operator>>((istream *)&std::cin,(string *)&local_d0);
      std::__cxx11::string::string((string *)&local_90,(string *)&local_d0);
      ev3dev::servo_motor::set_command(m,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
LAB_00113201:
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    else if (local_d5 == 100) {
      std::operator<<((ostream *)&std::cout,"mid pulse sp: ");
      std::istream::operator>>((istream *)&std::cin,&local_d4);
      ev3dev::servo_motor::set_mid_pulse_sp(m,local_d4);
      goto LAB_00113201;
    }
    if (local_d5 == 0x62) {
      std::__cxx11::string::~string((string *)&local_d0);
      return;
    }
  } while( true );
}

Assistant:

void motor_action(servo_motor &m)
{
  char c = 0;
  int new_value = 0;
  std::string new_mode;

  do
  {
    cout << endl
         << "*** servo motor (" << m.address() << ") actions ***" << endl
         << endl
         << "(c)ommand" << endl
         << "(p)osition_sp  (" << m.position_sp()  << ")" << endl
         << "(r)ate_sp      (" << m.rate_sp()      << ")" << endl
         << "mi(n) pulse sp (" << m.min_pulse_sp() << ")" << endl
         << "mi(d) pulse sp (" << m.mid_pulse_sp() << ")" << endl
         << "ma(x) pulse sp (" << m.max_pulse_sp() << ")" << endl
         << "p(o)larity     [" << m.polarity()     << "]" << endl;
    cout << endl << "(b)ack" << endl
         << endl
         << "Choice: ";
    cin >> c;

    switch (c)
    {
    case 'c':
      cout << "command (run, float): ";
      cin >> new_mode; m.set_command(new_mode); cout << endl;
      break;
    case 'p':
      cout << "position sp: "; cin >> new_value; m.set_position_sp(new_value); cout << endl;
      break;
    case 'o':
      cout << "polarity (normal, inverted): ";
      cin >> new_mode; m.set_polarity(new_mode); cout << endl;
      break;
    case 'r':
      cout << "rate sp: "; cin >> new_value; m.set_rate_sp(new_value); cout << endl;
      break;
    case 'n':
      cout << "min pulse sp: "; cin >> new_value; m.set_min_pulse_sp(new_value); cout << endl;
      break;
    case 'd':
      cout << "mid pulse sp: "; cin >> new_value; m.set_mid_pulse_sp(new_value); cout << endl;
      break;
    case 'x':
      cout << "max pulse sp: "; cin >> new_value; m.set_max_pulse_sp(new_value); cout << endl;
      break;
    }
  }
  while (c != 'b');
}